

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O2

int doeat(obj *otmp)

{
  boolean bVar1;
  char cVar2;
  byte bVar3;
  schar sVar4;
  schar sVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  undefined4 uVar11;
  long lVar12;
  ulong uVar13;
  obj *poVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  char *pcVar18;
  int incr;
  char *pcVar19;
  short sVar20;
  int iVar21;
  char *pcVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  obj *in_stack_fffffffffffffca8;
  char local_338 [128];
  char buf [256];
  char it_or_they [128];
  char foodsmell [256];
  
  if (u.uprops[0x22].intrinsic != 0) {
    pcVar19 = "If you can\'t breathe air, how can you consume solids?";
LAB_0018a893:
    iVar9 = 0;
LAB_0018a895:
    pline(pcVar19);
    return iVar9;
  }
  if (otmp == (obj *)0x0) {
    otmp = floorfood("eat");
    if (otmp == (obj *)0x0) {
      return 0;
    }
  }
  else {
    bVar1 = validate_object(otmp,"\f\x02\x03\b\t\v\x04\x05\a\x06\r\x0e\x0f\x10\n","eat");
    if (bVar1 == '\0') {
      return 0;
    }
  }
  bVar1 = check_capacity((char *)0x0);
  if (bVar1 != '\0') {
    return 0;
  }
  if ((u._1052_1_ & 0x40) != 0) {
    sVar20 = otmp->otyp;
    uVar6 = *(ushort *)&objects[sVar20].field_0x11;
    iVar9 = otmp->corpsenm;
    in_stack_fffffffffffffca8 = (obj *)(long)iVar9;
    pcVar19 = Tobjnam(otmp,"smell");
    strcpy(foodsmell,pcVar19);
    bVar23 = otmp->quan == 1;
    pcVar19 = "they";
    if (bVar23) {
      pcVar19 = "it";
    }
    pcVar18 = "one";
    if (bVar23) {
      pcVar18 = "it";
    }
    strcpy(it_or_they,pcVar19);
    sprintf(local_338,"Eat %s anyway?",pcVar18);
    if ((((long)sVar20 == 0x10e) || (otmp->otyp == 0x129)) || (otmp->otyp == 0x10f)) {
      if (iVar9 == 0xc) {
        if (u.uprops[8].extrinsic == 0) {
LAB_0018a9e1:
          if (((byte)youmonst.mintrinsics & 0x80) == 0) {
            bVar1 = poly_when_stoned(youmonst.data);
            bVar23 = bVar1 == '\0';
            goto LAB_0018aa97;
          }
        }
LAB_0018aa94:
        bVar23 = false;
      }
      else {
        if ((iVar9 == 0xb) && (u.uprops[8].extrinsic == 0)) goto LAB_0018a9e1;
        if (iVar9 != 0xd7) goto LAB_0018aa94;
        bVar23 = (youmonst.data != mons + 0xd7 &&
                 (youmonst.data != mons + 0x157 &&
                 (youmonst.data != mons + 0xa0 &&
                 (youmonst.data != mons + 0x20 && youmonst.data != mons + 0x73)))) &&
                 (u.uprops[0x3d].extrinsic == 0 && u.uprops[0x3d].intrinsic == 0);
      }
LAB_0018aa97:
      if (sVar20 != 0x10e) goto LAB_0018aaf2;
      lVar12 = 0;
      if ((iVar9 != 0xa3) && (iVar9 != 0x154)) {
        lVar12 = peek_at_iced_corpse_age(otmp);
        lVar12 = (long)((ulong)moves - lVar12) / 10;
        if ((*(uint *)&otmp->field_0x4a & 1) == 0) {
          if ((*(uint *)&otmp->field_0x4a & 2) != 0) {
            lVar12 = lVar12 + -2;
          }
        }
        else {
          lVar12 = lVar12 + 2;
        }
      }
    }
    else {
      bVar23 = false;
LAB_0018aaf2:
      lVar12 = 0;
    }
    if ((((lVar12 < 6 || (iVar9 == 8 || sVar20 != 0x10e)) || (u.uprops[0x34].intrinsic != 0)) ||
        (youmonst.data == mons + 0xfd || (youmonst.data)->mlet == ' ')) ||
       (bVar1 = defends(0x21,uwep), bVar1 != '\0')) {
      if (bVar23) {
        pcVar19 = "%s like %s could be something very dangerous! %s";
        goto LAB_0018ab74;
      }
      if (((*(uint *)&otmp->field_0x4a & 0x300) == 0) && (sVar20 != 0x10e || lVar12 < 4)) {
        uVar8 = (uint)in_stack_fffffffffffffca8;
        if (sVar20 == 0x10e) {
          if (((mons[(long)in_stack_fffffffffffffca8].mflags1 >> 0x1c & 1) != 0) &&
             (((u.uprops[6].intrinsic == 0 && u.uprops[6].extrinsic == 0 ||
               (((u.uprops[6].intrinsic >> 0x1a & 1) != 0 &&
                ((u.uprops[6].intrinsic & 0xfbffffff) == 0 && u.uprops[6].extrinsic == 0)))) &&
              (((byte)youmonst.mintrinsics & 0x20) == 0)))) {
            pcVar19 = "%s like %s might be poisonous! %s";
            goto LAB_0018ac2c;
          }
          cVar2 = mons[(long)in_stack_fffffffffffffca8].mlet;
          if ((((cVar2 == '\x02') || (cVar2 == '\n')) || (cVar2 == '\x16')) || (cVar2 == '\x19')) {
LAB_0018acd8:
            if ((((mons[(long)in_stack_fffffffffffffca8].mflags1 >> 0x1b & 1) == 0) ||
                (u.uprops[7].extrinsic != 0)) || (((byte)youmonst.mintrinsics & 0x40) != 0))
            goto LAB_0018ad02;
            pcVar19 = "%s rather acidic. %s";
          }
          else {
            if (cVar2 == '7') {
              if ((uVar8 | 2) == 0x106) goto LAB_0018acc1;
              goto LAB_0018acd8;
            }
            if (cVar2 == ' ') goto LAB_0018acd8;
            if (cVar2 != '*') {
              if ((cVar2 != '6') && ((cVar2 != '\x1f' || (uVar8 == 0x9e)))) goto LAB_0018acc1;
              goto LAB_0018acd8;
            }
            if (uVar8 != 0xd6) goto LAB_0018acd8;
LAB_0018acc1:
            if (u.roleplay.vegetarian == '\0') goto LAB_0018acd8;
            pcVar19 = "%s unhealthy. %s";
          }
        }
        else {
LAB_0018ad02:
          if ((((u.umonnum != 0xd9) || (u.umonster == 0xd9)) ||
              ((*(uint *)&otmp->field_0x4a >> 0xc & 1) == 0)) ||
             ((ushort)((*(ushort *)&objects[otmp->otyp].field_0x11 >> 4 & 0x1f) - 0x12) < 0xfff9)) {
            uVar17 = uVar6 >> 4 & 0x1f;
            if (u.roleplay.vegan != '\0') {
              if ((uVar17 < 0xb) && ((0x684U >> uVar17 & 1) != 0)) {
LAB_0018ad7b:
                pcVar19 = "%s foul and unfamiliar to you. %s";
                goto LAB_0018adea;
              }
              if (sVar20 == 0x10e) {
                uVar13 = (ulong)(byte)mons[(long)in_stack_fffffffffffffca8].mlet;
                if (0x37 < uVar13) goto LAB_0018ad7b;
                if ((0x40000102400404U >> (uVar13 & 0x3f) & 1) == 0) {
                  if (uVar13 == 0x1f) {
                    if (uVar8 == 0x9e) goto LAB_0018ad7b;
                  }
                  else if ((uVar13 != 0x37) || ((uVar8 | 2) == 0x106)) goto LAB_0018ad7b;
                }
              }
            }
            if (u.roleplay.vegetarian != '\0') {
              if (((ushort)uVar17 < 0xb) && ((0x680U >> uVar17 & 1) != 0)) goto LAB_0018ade3;
              if ((sVar20 == 0x10e) &&
                 ((((cVar2 = mons[(long)in_stack_fffffffffffffca8].mlet, cVar2 != '\x02' &&
                    (cVar2 != '\n')) && (cVar2 != '\x16')) && (cVar2 != '\x19')))) {
                if (cVar2 == '7') {
                  if ((uVar8 | 2) == 0x106) goto LAB_0018ade3;
                }
                else if (cVar2 != ' ') {
                  if (cVar2 == '*') {
                    if (uVar8 == 0xd6) goto LAB_0018ade3;
                  }
                  else if ((cVar2 != '6') && ((cVar2 != '\x1f' || (uVar8 == 0x9e)))) {
LAB_0018ade3:
                    pcVar19 = "%s unfamiliar to you. %s";
                    goto LAB_0018adea;
                  }
                }
              }
            }
            if ((lVar12 < 6 || (iVar9 == 8 || sVar20 != 0x10e)) ||
               (((u.uprops[0x34].intrinsic == 0 &&
                 (youmonst.data != mons + 0xfd && (youmonst.data)->mlet != ' ')) &&
                (bVar1 = defends(0x21,uwep), bVar1 == '\0')))) goto LAB_0018ae4d;
            pcVar19 = "%s like %s could be tainted! %s";
            goto LAB_0018ac2c;
          }
          pcVar19 = "%s disgusting to you right now. %s";
        }
LAB_0018adea:
        sprintf(buf,pcVar19,foodsmell,local_338);
      }
      else {
        pcVar19 = "%s like %s could be rotten! %s";
LAB_0018ac2c:
        sprintf(buf,pcVar19,foodsmell,it_or_they,local_338);
      }
    }
    else {
      pcVar19 = "%s like %s could be tainted! %s";
LAB_0018ab74:
      sprintf(buf,pcVar19,foodsmell,it_or_they,local_338);
    }
    cVar2 = yn_function(buf,"yn",'n');
    pcVar19 = body_part(0x11);
    pline("Your %s stops tingling and your sense of smell returns to normal.",pcVar19);
    u._1052_1_ = u._1052_1_ & 0xbf;
    if (cVar2 == 'n') {
      return 0;
    }
  }
LAB_0018ae4d:
  bVar1 = is_edible(otmp);
  if (bVar1 == '\0') {
    pcVar19 = "You cannot eat that!";
    goto LAB_0018a893;
  }
  if ((otmp->owornmask & 0x19007fU) != 0) {
    pcVar19 = "You can\'t eat something you\'re wearing.";
    goto LAB_0018a893;
  }
  sVar20 = otmp->otyp;
  uVar6 = *(ushort *)&objects[sVar20].field_0x11 >> 4;
  if ((((10 < (uVar6 & 0x1f)) && ((uVar6 & 0x1f) < 0x12)) && (u.umonnum == 0xd9)) &&
     ((*(uint *)&otmp->field_0x4a >> 0xc & 1) != 0)) {
    *(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a | 0x80;
    if (1 < otmp->quan) {
      if (otmp->where == '\x03') {
        otmp = splitobj(otmp,1);
      }
      else {
        splitobj(otmp,(ulong)(otmp->quan - 1));
      }
    }
    pcVar19 = xname(otmp);
    pline("Ulch!  That %s was rustproofed!",pcVar19);
    otmp->field_0x4b = otmp->field_0x4b & 0xef;
    uVar8 = u.uprops[0x1b].intrinsic;
    uVar17 = mt_random();
    make_stunned((ulong)(uVar8 + uVar17 % 10),'\x01');
    pcVar19 = xname(otmp);
    pcVar19 = the(pcVar19);
    pcVar18 = surface((int)u.ux,(int)u.uy);
    pline("You spit %s out onto the %s.",pcVar19,pcVar18);
    if (otmp->where == '\x03') {
      freeinv(otmp);
      dropy(otmp);
    }
    goto LAB_0018b22a;
  }
  iVar9 = 1;
  if (sVar20 == 0xb4) {
    pline("This ring is indigestible!");
    rottenfood(otmp);
    if ((otmp->field_0x4a & 0x20) == 0) {
      return 1;
    }
    if ((objects[otmp->otyp].field_0x10 & 1) == 0) {
      if (objects[otmp->otyp].oc_uname == (char *)0x0) {
        docall(otmp);
        return 1;
      }
      return 1;
    }
    return 1;
  }
  bVar3 = otmp->oclass;
  if (bVar3 == 7) {
    poVar14 = victual.piece;
    if (otmp == victual.piece) {
      bVar23 = true;
      if (((youmonst.data)->mlet != '0') && (((youmonst.data)->mflags2 & 0x100) == 0)) {
        bVar23 = youmonst.data == mons + 0x85;
      }
      poVar14 = otmp;
      if (bVar23 != ((*(uint *)&otmp->field_0x4a >> 0x1b & 1) != 0)) {
        victual.piece = (obj *)0x0;
        poVar14 = (obj *)0x0;
      }
    }
    if ((otmp == poVar14) && (poVar14 = otmp, (otmp->field_0x4d & 8) != 0)) {
      lVar12 = peek_at_iced_corpse_age(otmp);
      poVar14 = victual.piece;
      if (lVar12 + victual.usedtime + 5 < (long)(ulong)moves) {
        victual.piece = (obj *)0x0;
        poVar14 = (obj *)0x0;
      }
    }
    if (otmp == poVar14) {
      if (u.uhs != 0) {
        victual._20_1_ = victual._20_1_ & 0xfe;
      }
      victual.piece = touchfood(otmp);
      pline("You resume your meal.");
      poVar14 = victual.piece;
      goto LAB_0018b55a;
    }
    if (otmp->otyp == 0x129) {
      if ((int)(youmonst.data)->mflags1 < 0) {
        pcVar19 = "You bite right into the metal tin...";
      }
      else {
        if ((~(youmonst.data)->mflags1 & 0x6000) == 0) {
          pcVar19 = "You cannot handle the tin properly to open it.";
          goto LAB_0018a895;
        }
        if ((otmp->field_0x4a & 2) == 0) {
          if (uwep == (obj *)0x0) {
LAB_0018c37c:
            pline("It is not so easy to open this tin.");
            if (u.uprops[0x29].intrinsic != 0) {
              pcVar19 = body_part(3);
              pcVar19 = makeplural(pcVar19);
              pline("The tin slips from your %s.",pcVar19);
              if (1 < otmp->quan) {
                otmp = splitobj(otmp,1);
              }
              if (otmp->where == '\x03') {
                dropx(otmp);
                return 1;
              }
LAB_0018b22a:
              stackobj(in_stack_fffffffffffffca8);
              return 1;
            }
            sVar4 = acurr(3);
            sVar5 = acurrstr();
            iVar9 = rn2((int)(short)((short)(500 / (int)(short)((short)sVar5 + (short)sVar4)) + 1));
            iVar9 = iVar9 + 10;
            goto LAB_0018b865;
          }
          uVar6 = uwep->otyp;
          if (uVar6 < 0x1c) {
            if ((0x5be0000U >> (uVar6 & 0x1f) & 1) == 0) {
              if (uVar6 != 0x1b) goto LAB_0018c363;
              goto LAB_0018c375;
            }
            iVar9 = 3;
          }
          else {
LAB_0018c363:
            if (uVar6 == 0xf4) {
              iVar9 = 1;
            }
            else {
              if (uVar6 != 0x108) goto LAB_0018c37c;
LAB_0018c375:
              iVar9 = 6;
            }
          }
          pcVar19 = aobjnam(uwep,(char *)0x0);
          pline("Using your %s you try to open the tin.",pcVar19);
          goto LAB_0018b865;
        }
        pcVar19 = "The tin opens like magic!";
      }
      pline(pcVar19);
      iVar9 = 1;
LAB_0018b865:
      tin.usedtime = 0;
      tin.tin = otmp;
      tin.reqtime = iVar9;
      set_occupation(opentin,"opening the tin",0);
      return 1;
    }
    poVar14 = touchfood(otmp);
    victual._8_8_ = victual._8_8_ & 0xffffffff00000000;
    sVar20 = poVar14->otyp;
    uVar8 = 7;
    victual.piece = poVar14;
    if ((long)sVar20 == 0x10e) {
      uVar17 = poVar14->corpsenm;
      lVar12 = (long)(int)uVar17;
      uVar6 = mons[lVar12].geno;
      if (lVar12 == 0xc) {
        if (u.uprops[8].extrinsic == 0) {
LAB_0018b670:
          if (((byte)youmonst.mintrinsics & 0x80) == 0) {
            lVar15 = lVar12;
            bVar1 = poly_when_stoned(youmonst.data);
            uVar17 = (uint)lVar15;
            bVar23 = bVar1 == '\0';
            goto LAB_0018b69b;
          }
        }
        bVar23 = false;
      }
      else {
        bVar23 = false;
        if ((uVar17 == 0xb) && (bVar23 = false, u.uprops[8].extrinsic == 0)) goto LAB_0018b670;
      }
LAB_0018b69b:
      uVar6 = uVar6 >> 0xc;
      bVar3 = mons[lVar12].mlet;
      uVar7 = (uint)bVar3;
      if ((((uVar7 == 2) || (bVar3 == 10)) || (bVar3 == 0x16)) || (bVar3 == 0x19)) {
LAB_0018b6f8:
        uVar8 = 5;
LAB_0018b6fb:
        violated(uVar8);
        lVar15 = 0;
        if ((uVar17 != 0xa3) && (uVar17 != 0x154)) goto LAB_0018b721;
      }
      else {
        if (bVar3 == 0x37) {
          uVar8 = (uint)((uVar17 & 0xfffffffd) == 0x104) * 2 + 5;
          goto LAB_0018b6fb;
        }
        if (bVar3 == 0x20) goto LAB_0018b6f8;
        if (bVar3 == 0x2a) {
          uVar8 = uVar17 == 0xd6 | 6;
          goto LAB_0018b6fb;
        }
        if (bVar3 == 0x36) goto LAB_0018b6f8;
        if (bVar3 != 0x1f) goto LAB_0018b6fb;
        if (uVar17 != 0x9e) goto LAB_0018b6f8;
        violated(7);
LAB_0018b721:
        lVar15 = peek_at_iced_corpse_age(poVar14);
        uVar13 = (ulong)moves;
        uVar8 = mt_random();
        lVar15 = (long)(uVar13 - lVar15) / (long)(ulong)(uVar8 % 0x14 + 10);
        if ((*(uint *)&poVar14->field_0x4a & 1) == 0) {
          if ((*(uint *)&poVar14->field_0x4a & 2) != 0) {
            lVar15 = lVar15 + -2;
          }
        }
        else {
          lVar15 = lVar15 + 2;
        }
      }
      if (((youmonst.data)->mlet == '0') ||
         (youmonst.data == mons + 0x85 || ((youmonst.data)->mflags2 & 0x100) != 0)) {
        pcVar19 = "There is no blood left in this corpse!";
        if ((poVar14->field_0x4d & 8) == 0) {
          if (poVar14->oeaten < (uint)mons[poVar14->corpsenm].cnutrit) goto LAB_0018bac6;
        }
        else if (poVar14->oeaten <= (uint)(((ulong)mons[poVar14->corpsenm].cnutrit << 2) / 5))
        goto LAB_0018bac6;
        pcVar19 = "The blood in this corpse has coagulated!";
        if ((0 < lVar15) ||
           (lVar16 = peek_at_iced_corpse_age(poVar14), lVar16 + 5 < (long)(ulong)moves)) {
LAB_0018bac6:
          pline(pcVar19);
          victual.piece = (obj *)0x0;
          if (((poVar14->field_0x4d & 8) == 0) &&
             (poVar14->oeaten == (uint)mons[poVar14->corpsenm].cnutrit)) {
            poVar14->oeaten = 0;
          }
          u.uconduct.food = u.uconduct.food - 1;
          return 0;
        }
        if (((uVar6 & 1) == 0) ||
           (((u.uprops[0x23].intrinsic != 0 && (u.uprops[0x24].extrinsic == 0)) &&
            ((u.umonnum == u.umonster || (bVar1 = dmgtype(youmonst.data,0x24), bVar1 == '\0')))))) {
          pcVar19 = corpse_xname(poVar14,'\x01');
          pcVar19 = the(pcVar19);
          strcpy(buf,pcVar19);
        }
        else {
          pcVar19 = "";
          if ((mons[lVar12].mflags2 & 0x80000) == 0) {
            pcVar19 = "the ";
          }
          pcVar18 = s_suffix(mons[lVar12].mname);
          sprintf(buf,"%s%s corpse",pcVar19,pcVar18);
        }
        pline("You drain the blood from %s.");
        poVar14->field_0x4d = poVar14->field_0x4d | 8;
      }
      else {
        poVar14->field_0x4d = poVar14->field_0x4d & 0xf7;
      }
      if ((!(bool)(uVar17 == 8 | bVar23)) && (5 < lVar15)) {
        bVar1 = maybe_cannibal(uVar17,'\0');
        if ((uVar7 != 2) && (((uVar7 != 10 && (uVar7 != 0x16)) && (uVar7 != 0x19)))) {
          if (uVar7 == 0x37) {
            if ((uVar17 | 2) == 0x106) {
LAB_0018c611:
              pcVar19 = "protoplasm";
              if (uVar7 != 0x2a) {
                pcVar19 = "meat";
              }
              if (uVar17 == 0xd6) {
                pcVar19 = "meat";
              }
              goto LAB_0018c63a;
            }
          }
          else {
            if (uVar7 == 0x20) {
              pcVar19 = "fungoid vegetation";
              goto LAB_0018c63a;
            }
            if ((uVar7 != 0x36) && ((uVar7 != 0x1f || (uVar17 == 0x9e)))) goto LAB_0018c611;
          }
        }
        pcVar19 = "protoplasm";
LAB_0018c63a:
        pcVar22 = "";
        pcVar18 = "; you cannibal";
        if (bVar1 == '\0') {
          pcVar18 = "";
        }
        pline("Ulch!  That %s was tainted%s!",pcVar19,pcVar18);
        if (((u.uprops[0x34].intrinsic == 0) &&
            (youmonst.data != mons + 0xfd && (youmonst.data)->mlet != ' ')) &&
           (bVar1 = defends(0x21,uwep), bVar1 == '\0')) {
          uVar8 = mt_random();
          uVar8 = uVar8 % 10 + 10;
          uVar13 = 1;
          if (u.uprops[0x1d].intrinsic != 1) {
            uVar13 = (ulong)u.uprops[0x1d].intrinsic - 1;
          }
          if (uVar8 <= u.uprops[0x1d].intrinsic) {
            uVar13 = (ulong)uVar8;
          }
          if (u.uprops[0x1d].intrinsic == 0) {
            uVar13 = (ulong)uVar8;
          }
          if ((uVar6 & 1) == 0) {
            pcVar19 = corpse_xname(poVar14,'\x01');
            sprintf(buf,"rotted %s",pcVar19);
          }
          else {
            if ((mons[lVar12].mflags2 & 0x80000) == 0) {
              pcVar22 = "the ";
            }
            pcVar19 = mons_mname(mons + lVar12);
            pcVar19 = s_suffix(pcVar19);
            sprintf(buf,"%s%s rotted corpse",pcVar22,pcVar19);
          }
          make_sick(uVar13,buf,'\x01',1);
        }
        else {
          pline("It doesn\'t seem at all sickening, though...");
        }
        if (poVar14->where == '\x03') {
          useup(poVar14);
          victual.piece = (obj *)0x0;
          return 1;
        }
        useupf(poVar14,1);
        victual.piece = (obj *)0x0;
        return 1;
      }
      uVar8 = mons[lVar12].mflags1;
      if ((((uVar8 >> 0x1b & 1) == 0) || (u.uprops[7].extrinsic != 0)) ||
         (((byte)youmonst.mintrinsics & 0x40) != 0)) {
        if (((uVar8 >> 0x1c & 1) == 0) || (uVar10 = mt_random(), uVar10 % 5 == 0)) {
          bVar23 = true;
          if ((((5 < lVar15) || ((3 < lVar15 && (uVar10 = mt_random(), uVar10 % 5 != 0)))) &&
              (u.uprops[0x34].intrinsic == 0)) &&
             ((bVar23 = true, youmonst.data != mons + 0xfd && (youmonst.data)->mlet != ' ' &&
              (bVar1 = defends(0x21,uwep), bVar1 == '\0')))) {
            pcVar19 = "very ";
            if (u.uprops[0x1d].intrinsic == 0) {
              pcVar19 = "";
            }
            pline("You feel %ssick.",pcVar19);
            iVar9 = rnd(8);
            pcVar19 = "cadaver";
            goto LAB_0018c222;
          }
        }
        else {
          pline("Ecch - that must have been poisonous!");
          if (u.uprops[6].intrinsic == 0 && u.uprops[6].extrinsic == 0) {
            if (((byte)youmonst.mintrinsics & 0x20) != 0) goto LAB_0018c513;
            iVar9 = rnd(4);
            losestr(iVar9,'\0');
            iVar9 = 0xf;
            if (((u.uprops[6].intrinsic >> 0x1a & 1) != 0) &&
               ((u.uprops[6].intrinsic & 0xfbffffff) == 0 && u.uprops[6].extrinsic == 0))
            goto LAB_0018c4e3;
LAB_0018c4fc:
            iVar9 = rnd(iVar9);
            losehp(iVar9,"poisonous corpse",0);
          }
          else {
            if (((u.uprops[6].intrinsic >> 0x1a & 1) != 0) &&
               (((u.uprops[6].intrinsic & 0xfbffffff) == 0 && u.uprops[6].extrinsic == 0 &&
                (((byte)youmonst.mintrinsics & 0x20) == 0)))) {
LAB_0018c4e3:
              iVar9 = (uint)(((byte)youmonst.mintrinsics & 0x20) >> 5) * 8 + 7;
              goto LAB_0018c4fc;
            }
LAB_0018c513:
            pline("You seem unaffected by the poison.");
          }
          bVar23 = false;
          exercise(4,'\0');
        }
      }
      else {
        pline("You have a very bad case of stomach acid.");
        iVar9 = rnd(0xf);
        pcVar19 = "acidic corpse";
LAB_0018c222:
        bVar23 = false;
        losehp(iVar9,pcVar19,0);
      }
      lVar15 = (ulong)(mons[lVar12].cwt >> 6) + 3;
      iVar9 = (int)lVar15;
      victual.reqtime = iVar9;
      if ((poVar14->field_0x4d & 8) != 0) {
        victual.reqtime = rounddiv(lVar15,5);
      }
      if ((((bVar23) && (uVar17 != 0xa3)) && (uVar17 != 0x154)) &&
         (((poVar14->field_0x4b & 3) != 0 || (uVar10 = mt_random(), uVar10 % 7 == 0)))) {
        iVar9 = rottenfood(poVar14);
        cVar2 = iVar9 != 0;
        if ((bool)cVar2) {
          *(uint *)&poVar14->field_0x4a = *(uint *)&poVar14->field_0x4a & 0xfffffcff | 0x100;
          touchfood(poVar14);
        }
        if (mons[poVar14->corpsenm].cnutrit == 0) {
          if (iVar9 == 0) {
            pline("The corpse rots away completely.");
          }
          if (poVar14->where == '\x03') {
            useup(poVar14);
          }
          else {
            useupf(poVar14,1);
          }
          cVar2 = '\x02';
        }
        else {
          if (iVar9 == 0) {
            consume_oeaten(poVar14,2);
          }
          if (((poVar14->field_0x4d & 8) != 0) &&
             (uVar17 = (uint)(((ulong)mons[poVar14->corpsenm].cnutrit << 2) / 5),
             poVar14->oeaten < uVar17)) {
            poVar14->oeaten = uVar17;
          }
        }
      }
      else {
        cVar2 = '\0';
        if (((youmonst.data)->mlet != '0') &&
           (youmonst.data != mons + 0x85 && ((youmonst.data)->mflags2 & 0x100) == 0)) {
          if ((uVar6 & 1) == 0) {
            pcVar19 = "This ";
          }
          else {
            pcVar19 = "";
            if ((mons[lVar12].mflags2 & 0x80000) == 0) {
              pcVar19 = "The ";
            }
          }
          pcVar18 = food_xname(poVar14,'\0');
          if (0x37 < uVar7) goto LAB_0018cd02;
          uVar13 = (ulong)uVar7;
          if ((0x40000102400404U >> (uVar13 & 0x3f) & 1) == 0) {
            if (uVar13 == 0x1f) {
              if (uVar17 == 0x9e) goto LAB_0018cd02;
              goto LAB_0018c71e;
            }
            if ((uVar13 == 0x37) && ((uVar17 | 2) != 0x106)) goto LAB_0018c71e;
LAB_0018cd02:
            uVar17 = (uint)(((youmonst.data)->mflags1 & 0x60000000) == 0x20000000);
          }
          else {
LAB_0018c71e:
            uVar17 = (uint)(((youmonst.data)->mflags1 >> 0x1d & 1) == 0) &
                     (youmonst.data)->mflags1 >> 0x1e;
          }
          pcVar22 = "is delicious";
          if (uVar17 == 0) {
            pcVar22 = "tastes terrible";
          }
          cVar2 = '\0';
          pline("%s%s %s!",pcVar19,pcVar18,pcVar22);
        }
      }
      if ((uVar8 & 0x80004) == 0) {
        if (uVar7 == 2) goto LAB_0018cd81;
      }
      else if ((0x2d < uVar7) || ((0x210000002000U >> ((ulong)uVar7 & 0x3f) & 1) == 0)) {
LAB_0018cd81:
        uVar17 = mt_random();
        if ((uVar17 % 5 == 0) &&
           (((youmonst.data)->mlet != '0' &&
            (youmonst.data != mons + 0x85 && ((youmonst.data)->mflags2 & 0x100) == 0)))) {
          pcVar19 = "glibbery";
          if ((uVar8 & 4) == 0) {
            pcVar19 = "slimy";
          }
          pcVar18 = body_part(3);
          pcVar18 = makeplural(pcVar18);
          pcVar22 = "even more";
          if (u.uprops[0x29].intrinsic == 0) {
            pcVar22 = "very";
          }
          pline("Eating this %s corpse makes your %s %s slippery.",pcVar19,pcVar18,pcVar22);
          uVar8 = rnd(0xf);
          incr_itimeout(&u.uprops[0x29].intrinsic,(ulong)uVar8);
        }
      }
      if (cVar2 == '\0') goto LAB_0018c77a;
      if (cVar2 == '\x02') {
        victual.piece = (obj *)0x0;
        return 1;
      }
      bVar23 = false;
      goto LAB_0018c77d;
    }
    if ((*(ushort *)&objects[sVar20].field_0x11 & 0x1f0) == 0x40) {
      uVar8 = sVar20 == 0x10f ^ 7;
    }
    else {
      uVar8 = ((ushort)(sVar20 - 0x11fU) < 5) + 5;
    }
    violated(uVar8);
    sVar20 = poVar14->otyp;
    iVar9 = (int)objects[sVar20].oc_delay;
    victual.reqtime = iVar9;
    if ((long)sVar20 == 0x122) goto switchD_0018bc45_caseD_117;
    uVar8 = *(uint *)&poVar14->field_0x4a;
    if ((uVar8 & 1) != 0) {
LAB_0018b81a:
      iVar9 = rottenfood(poVar14);
      bVar23 = iVar9 == 0;
      if (!bVar23) {
        *(uint *)&poVar14->field_0x4a = *(uint *)&poVar14->field_0x4a & 0xfffffcff | 0x100;
      }
      if (1 < poVar14->oeaten) {
        consume_oeaten(poVar14,1);
        goto LAB_0018c77d;
      }
      victual.piece = (obj *)0x0;
      goto LAB_0018b9a5;
    }
    uVar17 = 0x32;
    if ((uVar8 & 2) == 0) {
      uVar17 = 0x1e;
    }
    if (uVar17 < moves - poVar14->age) {
      if (((uVar8 & 0x300) != 0) || (uVar8 = mt_random(), uVar8 % 7 == 0)) goto LAB_0018b81a;
      sVar20 = poVar14->otyp;
    }
    switch(sVar20) {
    case 0x116:
    case 0x118:
      if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
         ((u.umonnum != u.umonster && (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0')))) {
        pcVar19 = "Core dumped.";
      }
      else {
        uVar8 = rnd(100);
        if (uVar8 < 0x4c) {
          pcVar19 = "Segmentation fault -- core dumped.";
        }
        else if (uVar8 < 100) {
          pcVar19 = "Bus error -- core dumped.";
        }
        else {
          pcVar19 = "Yo\' mama -- core dumped.";
        }
      }
      pline(pcVar19);
      break;
    case 0x117:
    case 0x119:
    case 0x11a:
    case 0x11b:
    case 0x11c:
      goto switchD_0018bc45_caseD_117;
    case 0x11d:
      if (((youmonst.data)->mflags2 & 2) == 0) goto switchD_0018bc45_caseD_117;
      iVar9 = rn2(victual.reqtime);
      uVar8 = iVar9 + 5;
      bVar1 = '\0';
LAB_0018cb51:
      make_vomiting((ulong)uVar8,bVar1);
      goto LAB_0018c77a;
    case 0x11e:
      if (((poVar14->field_0x4a & 1) != 0) || (current_fruit != poVar14->spe))
      goto switchD_0018bc45_caseD_117;
      pcVar19 = "yummy";
      if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
        if (u.umonnum == u.umonster) {
          pcVar19 = "primo";
        }
        else {
          bVar1 = dmgtype(youmonst.data,0x24);
          pcVar19 = "yummy";
          if (bVar1 == '\0') {
            pcVar19 = "primo";
          }
        }
      }
      pcVar18 = singular(poVar14,xname);
      pline("My, that was a %s %s!",pcVar19,pcVar18);
      break;
    default:
      if (sVar20 == 0x10d) {
        if (((youmonst.data)->mflags1 & 0x20020000) == 0x20000000) {
          pcVar19 = "That tripe ration was surprisingly good!";
LAB_0018ceae:
          pline(pcVar19);
        }
        else {
          if (u.umonnum == u.umonster) {
            if (urace.malenum == 0x4a) {
LAB_0018cca4:
              pcVar19 = "Tastes great! Less filling!";
              if (u.uprops[0x24].extrinsic != 0 || u.uprops[0x23].intrinsic == 0) {
                pcVar19 = "Mmm, tripe... not bad!";
              }
              if ((u.umonnum != u.umonster &&
                   (u.uprops[0x24].extrinsic == 0 && u.uprops[0x23].intrinsic != 0)) &&
                 (bVar1 = dmgtype(youmonst.data,0x24), pcVar19 = "Tastes great! Less filling!",
                 bVar1 != '\0')) {
                pcVar19 = "Mmm, tripe... not bad!";
              }
              goto LAB_0018ceae;
            }
          }
          else if (((youmonst.data)->mflags2 & 0x80) != 0) goto LAB_0018cca4;
          pline("Yak - dog food!");
          if (urole.malenum == 0x15d) {
            pline("At least it\'s not prison food.");
          }
          more_experienced(1,1,0);
          newexplevel();
          uVar8 = mt_random();
          if ((uVar8 & 1) != 0) {
            auVar24._8_2_ = urole.guardnum;
            auVar24._10_2_ = urole.neminum;
            auVar24._12_2_ = urole.questarti;
            auVar24._14_2_ = urole.allow;
            auVar24._0_8_ =
                 CONCAT62(urole._210_6_,urole.malenum) & 0xffffffff0000ffff |
                 (ulong)(ushort)urace.malenum << 0x10;
            auVar24 = pshuflw(auVar24,auVar24,0x50);
            auVar25._0_2_ = -(ushort)(auVar24._0_2_ == 0);
            auVar25._2_2_ = -(ushort)(auVar24._2_2_ == 0x15b);
            auVar25._4_2_ = -(ushort)(auVar24._4_2_ == 0);
            auVar25._6_2_ = -(ushort)(auVar24._6_2_ == 0x4a);
            auVar25._8_2_ = -(ushort)(auVar24._4_2_ == 0);
            auVar25._10_2_ = -(ushort)(auVar24._6_2_ == 0xe8);
            auVar25._12_2_ = -(ushort)(auVar24._0_2_ == 0);
            auVar25._14_2_ = -(ushort)(auVar24._2_2_ == 0x15d);
            uVar11 = movmskps(0x355940,auVar25);
            if ((char)uVar11 == '\0') {
              iVar9 = rn2(victual.reqtime);
              make_vomiting((ulong)(iVar9 + 0xe),'\0');
            }
          }
        }
LAB_0018ceb8:
        bVar23 = true;
        goto LAB_0018c77d;
      }
      if (sVar20 == 0x10f) {
        if (400 < moves - poVar14->age) {
          pline("Ugh.  Rotten egg.");
          if ((urole.malenum != 0x15d) || (uVar8 = mt_random(), (int)(uVar8 & 7) <= u.ulevel)) {
            uVar8 = u.uprops[0x2f].intrinsic;
            iVar9 = dice(10,4);
            uVar8 = uVar8 + iVar9;
            bVar1 = '\x01';
            goto LAB_0018cb51;
          }
          pcVar19 = "You feel a slight stomach ache.";
          goto LAB_0018ceae;
        }
      }
      else if (sVar20 == 0x126) {
        if (u.uhunger < 0xc9) {
          pcVar19 = "That food really hit the spot!";
          if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
            if (u.umonnum == u.umonster) {
              pcVar19 = "Oh wow, like, superior, man!";
            }
            else {
              bVar1 = dmgtype(youmonst.data,0x24);
              pcVar19 = "That food really hit the spot!";
              if (bVar1 == '\0') {
                pcVar19 = "Oh wow, like, superior, man!";
              }
            }
          }
          goto LAB_0018ceae;
        }
        if ((uint)u.uhunger < 0x2bd) {
          pcVar19 = body_part(0x12);
          pline("That satiated your %s!",pcVar19);
        }
        goto LAB_0018ceb8;
      }
      goto switchD_0018bc45_caseD_117;
    }
    bVar23 = true;
LAB_0018c77d:
    if ((long)poVar14->otyp == 0x10e) {
      uVar6 = mons[poVar14->corpsenm].cnutrit;
      uVar17 = (uint)uVar6;
      uVar8 = poVar14->oeaten;
      if ((poVar14->field_0x4d & 8) != 0) {
        uVar17 = ((uint)uVar6 * 4) / 5;
        uVar8 = uVar8 - uVar17;
        uVar17 = uVar6 - uVar17;
      }
    }
    else {
      uVar17 = (uint)objects[poVar14->otyp].oc_nutrition;
      uVar8 = poVar14->oeaten;
    }
    iVar21 = 0;
    iVar9 = 0;
    if (uVar17 != 0) {
      iVar9 = rounddiv((long)(int)uVar8 * (long)victual.reqtime,uVar17);
    }
    victual.reqtime = iVar9;
    if ((iVar9 != 0) && (uVar8 != 0)) {
      if ((int)uVar8 < iVar9) {
        iVar21 = iVar9 % (int)uVar8;
      }
      else {
        iVar21 = -((int)uVar8 / iVar9);
      }
    }
    victual._20_1_ = victual._20_1_ & 0xfe | u.uhs == 0;
    victual.nmod = iVar21;
    if (!bVar23) {
      return 1;
    }
LAB_0018b55a:
    start_eating(poVar14);
    return 1;
  }
  victual.usedtime = 0;
  victual.reqtime = 1;
  victual._20_1_ = victual._20_1_ & 0xfe | u.uhs == 0;
  victual.piece = otmp;
  if (bVar3 - 0xf < 2) {
    victual.nmod = weight(otmp);
    uVar6 = *(ushort *)&objects[otmp->otyp].field_0x11 >> 4;
  }
  else if (bVar3 == 0xc) {
    victual.nmod = 2000;
    if (otmp->quan < 0x30d41) {
      victual.nmod = otmp->quan / 100;
    }
  }
  else {
    victual.nmod = (uint)objects[sVar20].oc_nutrition;
  }
  victual._20_1_ = victual._20_1_ | 4;
  uVar6 = (uVar6 & 0x1f) - 2;
  if (uVar6 < 9) {
    iVar9 = *(int *)(&DAT_00294510 + (ulong)uVar6 * 4);
  }
  else {
    iVar9 = 5;
  }
  violated(iVar9);
  uVar8 = *(uint *)&otmp->field_0x4a;
  if ((uVar8 & 1) != 0) {
    rottenfood(otmp);
    uVar8 = *(uint *)&otmp->field_0x4a;
  }
  if (otmp->oclass == '\x02') {
    if ((short)uVar8 < 0) {
      iVar9 = 0xf;
      pline("Ecch - that must have been poisonous!");
      if (u.uprops[6].intrinsic == 0 && u.uprops[6].extrinsic == 0) {
        if (((byte)youmonst.mintrinsics & 0x20) == 0) {
          iVar21 = rnd(4);
          losestr(iVar21,'\0');
          uVar8 = u.uprops[6].intrinsic;
          if ((u.uprops[6].intrinsic >> 0x1a & 1) != 0) goto LAB_0018b2e5;
          goto LAB_0018b30d;
        }
      }
      else if ((((u.uprops[6].intrinsic >> 0x1a & 1) != 0) &&
               ((u.uprops[6].intrinsic & 0xfbffffff) == 0 && u.uprops[6].extrinsic == 0)) &&
              (uVar8 = 0, ((byte)youmonst.mintrinsics & 0x20) == 0)) {
LAB_0018b2e5:
        if ((uVar8 & 0xfbffffff) == 0 && u.uprops[6].extrinsic == 0) {
          iVar9 = (uint)(((byte)youmonst.mintrinsics & 0x20) >> 5) * 8 + 7;
        }
LAB_0018b30d:
        iVar9 = rnd(iVar9);
        pcVar19 = xname(otmp);
        losehp(iVar9,pcVar19,0);
        goto LAB_0018b33a;
      }
      pline("You seem unaffected by the poison.");
    }
    else if ((uVar8 & 1) == 0) {
LAB_0018b16b:
      pcVar19 = singular(otmp,xname);
      goto LAB_0018b17a;
    }
  }
  else if ((uVar8 & 1) == 0) {
    if (otmp->oclass != '\f') goto LAB_0018b16b;
    pcVar19 = foodword(otmp);
LAB_0018b17a:
    pline("This %s is delicious!",pcVar19);
  }
LAB_0018b33a:
  poVar14 = victual.piece;
  set_occupation(eatfood,"eating non-food",0);
  lesshungry(victual.nmod);
  occupation = (_func_int *)0x0;
  victual.piece = (obj *)0x0;
  victual._20_1_ = victual._20_1_ & 0xfb;
  bVar3 = poVar14->oclass;
  if (bVar3 != 8) {
    if (bVar3 != 0xc) goto LAB_0018b3ae;
    if (poVar14->where == '\0') {
      dealloc_obj(poVar14);
      return 1;
    }
    lVar12 = (long)poVar14->quan;
    goto LAB_0018b9c6;
  }
  poVar14->quan = poVar14->quan + 1;
  dopotion(poVar14);
  bVar3 = poVar14->oclass;
LAB_0018b3ae:
  sVar20 = poVar14->otyp;
  if ((bVar3 & 0xfe) != 4) {
    if (sVar20 == 0xf1) {
      if (poVar14->corpsenm != 0) {
        o_unleash(poVar14);
      }
      goto LAB_0018b47d;
    }
    goto LAB_0018b482;
  }
  uVar8 = u.uprops[objects[sVar20].oc_oprop].intrinsic;
  if ((uleft == poVar14) || (uright == poVar14)) {
    Ring_gone(poVar14);
    if (u.uhp < 1) goto LAB_0018b47d;
    bVar3 = poVar14->oclass;
  }
  poVar14->field_0x4a = poVar14->field_0x4a | 0x30;
  iVar9 = rn2((uint)(bVar3 != 4) * 2 + 3);
  if (iVar9 != 0) goto LAB_0018b47d;
  iVar9 = (int)sVar20;
  switch(poVar14->otyp) {
  case 0x9d:
    accessory_has_effect(poVar14);
    incr = (int)poVar14->spe;
    iVar21 = 5;
    break;
  case 0x9e:
    accessory_has_effect(poVar14);
    incr = (int)poVar14->spe;
    iVar21 = 0;
    break;
  case 0x9f:
    accessory_has_effect(poVar14);
    incr = (int)poVar14->spe;
    iVar21 = 4;
    break;
  case 0xa0:
    accessory_has_effect(poVar14);
    incr = (int)poVar14->spe;
    iVar21 = 1;
    break;
  case 0xa1:
    accessory_has_effect(poVar14);
    incr = (int)poVar14->spe;
    iVar21 = 2;
    break;
  case 0xa2:
    accessory_has_effect(poVar14);
    incr = (int)poVar14->spe;
    iVar21 = 3;
    break;
  case 0xa3:
    accessory_has_effect(poVar14);
    u.uhitinc = u.uhitinc + poVar14->spe;
    goto LAB_0018b47d;
  case 0xa4:
    accessory_has_effect(poVar14);
    u.udaminc = u.udaminc + poVar14->spe;
    goto LAB_0018b47d;
  case 0xa5:
    accessory_has_effect(poVar14);
    u.uprops[0x16].intrinsic._3_1_ = u.uprops[0x16].intrinsic._3_1_ | 4;
    u.ublessed = u.ublessed + poVar14->spe;
LAB_0018c045:
    iflags.botl = '\x01';
    goto LAB_0018b47d;
  case 0xa6:
  case 0xa7:
  case 0xa8:
  case 0xaa:
  case 0xab:
  case 0xac:
  case 0xad:
  case 0xae:
  case 0xaf:
  case 0xb0:
  case 0xb1:
  case 0xb2:
switchD_0018b44d_caseD_a6:
    uVar13 = (ulong)objects[sVar20].oc_oprop;
    if (uVar13 == 0) goto LAB_0018b47d;
    uVar17 = u.uprops[uVar13].intrinsic;
    if ((uVar17 >> 0x1a & 1) == 0) {
      accessory_has_effect(poVar14);
      uVar13 = (ulong)objects[sVar20].oc_oprop;
      uVar17 = u.uprops[uVar13].intrinsic;
    }
    u.uprops[uVar13].intrinsic = uVar17 | 0x4000000;
    if (sVar20 != 0xaa) {
      if (sVar20 == 0xb9) {
        if ((((uVar8 == 0) && (u.uprops[0xd].extrinsic == 0)) &&
            ((u.uprops[0xd].blocked == 0 &&
             ((u.uprops[0xc].intrinsic == 0 && (u.uprops[0xc].extrinsic == 0)))))) &&
           (uVar8 = (youmonst.data)->mflags1, (uVar8 >> 0x18 & 1) == 0)) {
          if (u.uprops[0x1e].intrinsic == 0) {
            if (ublindf == (obj *)0x0) {
              if ((uVar8 >> 0xc & 1) != 0) goto LAB_0018b47d;
            }
            else if (((uVar8 >> 0xc & 1) != 0) || (ublindf->otyp != 0xed)) goto LAB_0018cc27;
LAB_0018cf51:
            newsym((int)u.ux,(int)u.uy);
            pcVar19 = "strange";
            if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
              if (u.umonnum == u.umonster) {
                pcVar19 = "normal";
              }
              else {
                bVar1 = dmgtype(youmonst.data,0x24);
                pcVar19 = "strange";
                if (bVar1 == '\0') {
                  pcVar19 = "normal";
                }
              }
            }
            pline("Your body takes on a %s transparency...",pcVar19);
            iVar9 = 0xb9;
            goto LAB_0018be63;
          }
          if (ublindf != (obj *)0x0) {
LAB_0018cc27:
            if (ublindf->oartifact == '\x1d') goto LAB_0018cf51;
          }
        }
      }
      else if (sVar20 == 0xbb) {
        resistcham();
      }
      else if (sVar20 == 0xba) {
        set_mimic_blocking();
        see_monsters();
        if (((((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
               (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0)) &&
             (u.uprops[0xd].blocked == 0)) && (uVar8 == 0)) &&
           ((u.uprops[0xc].extrinsic == 0 &&
            (uVar8 = (youmonst.data)->mflags1, (uVar8 >> 0x18 & 1) == 0)))) {
          if (u.uprops[0x1e].intrinsic == 0) {
            if (ublindf == (obj *)0x0) {
              if ((uVar8 >> 0xc & 1) != 0) goto LAB_0018b47d;
            }
            else if (((uVar8 >> 0xc & 1) != 0) || (ublindf->otyp != 0xed)) goto LAB_0018bfee;
LAB_0018cf98:
            newsym((int)u.ux,(int)u.uy);
            pline("Suddenly you can see yourself.");
            iVar9 = 0xba;
            goto LAB_0018be63;
          }
          if (ublindf != (obj *)0x0) {
LAB_0018bfee:
            if (ublindf->oartifact == '\x1d') goto LAB_0018cf98;
          }
        }
      }
      goto LAB_0018b47d;
    }
    u.uprops[0x12].intrinsic = uVar8;
    if ((uVar8 != 0 || u.uprops[0x12].extrinsic != 0) || ((youmonst.data)->mlet == '\x05'))
    goto LAB_0018b47d;
    float_up();
    iVar9 = dice(10,0x14);
    incr_itimeout(&u.uprops[0x12].intrinsic,(long)iVar9);
    iVar9 = 0xaa;
    goto LAB_0018be63;
  case 0xa9:
    goto switchD_0018b44d_caseD_a9;
  case 0xb3:
    if ((u.uprops[3].intrinsic >> 0x1a & 1) == 0) {
      accessory_has_effect(poVar14);
    }
    uVar8 = u.uprops[3].intrinsic;
    if (((u.uprops[3].extrinsic == 0 && u.uprops[3].intrinsic == 0) &&
        (uVar8 = 0, ((byte)youmonst.mintrinsics & 4) == 0)) && (u.uprops[0x38].extrinsic == 0)) {
      pline("You feel wide awake.");
      uVar8 = u.uprops[3].intrinsic;
    }
    u.uprops[3].intrinsic = uVar8 | 0x4000000;
    goto LAB_0018b47d;
  default:
    switch(poVar14->otyp) {
    case 0xca:
    case 0xd0:
      goto switchD_0018b44d_caseD_a9;
    case 0xcb:
      choke(poVar14);
      break;
    case 0xcc:
      if ((u.uprops[0x1f].intrinsic & 0x4000000) == 0) {
        accessory_has_effect(poVar14);
      }
      uVar8 = rnd(100);
      u.uprops[0x1f].intrinsic = uVar8 | 0x4000000;
      break;
    default:
      goto switchD_0018b44d_caseD_a6;
    case 0xce:
      accessory_has_effect(poVar14);
      discover_object(iVar9,'\x01','\x01');
      change_sex();
      pcVar19 = "feminine";
      if (flags.female == '\0') {
        pcVar19 = "masculine";
      }
      pline("You are suddenly very %s!",pcVar19);
      goto LAB_0018c045;
    case 0xcf:
      if ((u.uprops[0x3d].extrinsic == 0 && u.uprops[0x3d].intrinsic == 0) &&
         (u.umonnum != u.umonster)) {
        accessory_has_effect(poVar14);
        discover_object(iVar9,'\x01','\x01');
        rehumanize();
      }
    }
    goto LAB_0018b47d;
  }
  bVar1 = adjattrib(iVar21,incr,'\0',-1);
  if (bVar1 != '\0') {
LAB_0018be63:
    discover_object(iVar9,'\x01','\x01');
  }
LAB_0018b47d:
  sVar20 = poVar14->otyp;
LAB_0018b482:
  if (sVar20 == 0x10) {
    if ((poVar14->field_0x4a & 1) == 0) {
      pcVar19 = "That was pure chewing satisfaction!";
      if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
        if (u.umonnum == u.umonster) {
          pcVar19 = "Four out of five dentists agree.";
        }
        else {
          bVar1 = dmgtype(youmonst.data,0x24);
          pcVar19 = "That was pure chewing satisfaction!";
          if (bVar1 == '\0') {
            pcVar19 = "Four out of five dentists agree.";
          }
        }
      }
      pline(pcVar19);
      exercise(2,'\x01');
      sVar20 = poVar14->otyp;
      goto LAB_0018b918;
    }
  }
  else {
LAB_0018b918:
    if ((sVar20 == 0x212) && ((poVar14->field_0x4a & 1) == 0)) {
      pline("Yabba-dabba delicious!");
      exercise(4,'\x01');
    }
  }
switchD_0018b44d_caseD_a9:
  if ((poVar14 == uwep) && (poVar14->quan == 1)) {
    uwepgone();
  }
  if ((poVar14 == uquiver) && (poVar14->quan == 1)) {
    uqwepgone();
  }
  if ((poVar14 == uswapwep) && (poVar14->quan == 1)) {
    uswapwepgone();
  }
  if (poVar14 == uball) {
    unpunish();
  }
  if (poVar14 == uchain) {
    unpunish();
  }
  else {
LAB_0018b9a5:
    if (poVar14->where == '\x03') {
      useup(poVar14);
    }
    else {
      lVar12 = 1;
LAB_0018b9c6:
      useupf(poVar14,lVar12);
    }
  }
  return 1;
switchD_0018bc45_caseD_117:
  pcVar19 = singular(poVar14,xname);
  if ((poVar14->field_0x4a & 1) == 0) {
    uVar8 = (ushort)poVar14->otyp - 0x125;
    if ((uVar8 < 4) && (uVar8 != 1)) {
      pcVar18 = "bland.";
    }
    else {
      pcVar18 = "delicious!";
      if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
        if (u.umonnum == u.umonster) {
          pcVar18 = "gnarly!";
        }
        else {
          bVar1 = dmgtype(youmonst.data,0x24);
          pcVar18 = "delicious!";
          if (bVar1 == '\0') {
            pcVar18 = "gnarly!";
          }
        }
      }
    }
  }
  else {
    pcVar18 = "terrible!";
    if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
      if (u.umonnum == u.umonster) {
        pcVar18 = "grody!";
      }
      else {
        bVar1 = dmgtype(youmonst.data,0x24);
        pcVar18 = "terrible!";
        if (bVar1 == '\0') {
          pcVar18 = "grody!";
        }
      }
    }
  }
  pline("This %s is %s",pcVar19,pcVar18);
LAB_0018c77a:
  bVar23 = true;
  goto LAB_0018c77d;
}

Assistant:

int doeat(struct obj *otmp)	/* generic "eat" command funtion (see cmd.c) */
{
	int basenutrit;			/* nutrition of full item */
	int nutrit;			/* nutrition available */
	boolean dont_start = FALSE;
	
	if (Strangled) {
		pline("If you can't breathe air, how can you consume solids?");
		return 0;
	}
	if (otmp && !validate_object(otmp, allobj, "eat"))
		return 0;
	else if (!otmp)
		otmp = floorfood("eat");
	if (!otmp) return 0;
	if (check_capacity(NULL)) return 0;

	if (u.uedibility) {
		int res = edibility_prompts(otmp);
		if (res) {
		    pline("Your %s stops tingling and your sense of smell returns to normal.",
			body_part(NOSE));
		    u.uedibility = 0;
		    if (res == 1) return 0;
		}
	}

	/* We have to make non-foods take 1 move to eat, unless we want to
	 * do ridiculous amounts of coding to deal with partly eaten plate
	 * mails, players who polymorph back to human in the middle of their
	 * metallic meal, etc....
	 */
	if (!is_edible(otmp)) {
	    pline("You cannot eat that!");
	    return 0;
	} else if ((otmp->owornmask & (W_ARMOR | W_TOOL | W_AMUL | W_SADDLE)) != 0) {
	    /* let them eat rings */
	    pline("You can't eat something you're wearing.");
	    return 0;
	}
	if (is_metallic(otmp) &&
	    u.umonnum == PM_RUST_MONSTER && otmp->oerodeproof) {
	    	otmp->rknown = TRUE;
		if (otmp->quan > 1L) {
		    if (!carried(otmp))
			splitobj(otmp, otmp->quan - 1L);
		    else
			otmp = splitobj(otmp, 1L);
		}
		pline("Ulch!  That %s was rustproofed!", xname(otmp));
		/* The regurgitated object's rustproofing is gone now */
		otmp->oerodeproof = 0;
		make_stunned(HStun + rn2(10), TRUE);
		pline("You spit %s out onto the %s.", the(xname(otmp)),
			surface(u.ux, u.uy));
		if (carried(otmp)) {
			freeinv(otmp);
			dropy(otmp);
		}
		stackobj(otmp);
		return 1;
	}
	/* KMH -- Slow digestion is... indigestible */
	if (otmp->otyp == RIN_SLOW_DIGESTION) {
		pline("This ring is indigestible!");
		rottenfood(otmp);
		if (otmp->dknown && !objects[otmp->otyp].oc_name_known
				&& !objects[otmp->otyp].oc_uname)
			docall(otmp);
		return 1;
	}
	if (otmp->oclass != FOOD_CLASS) {
	    int material;
	    victual.reqtime = 1;
	    victual.piece = otmp;
		/* Don't split it, we don't need to if it's 1 move */
	    victual.usedtime = 0;
	    victual.canchoke = (u.uhs == SATIATED);
		/* Note: gold weighs 1 pt. for each 1000 pieces (see */
		/* pickup.c) so gold and non-gold is consistent. */
	    if (otmp->oclass == COIN_CLASS)
		basenutrit = ((otmp->quan > 200000L) ? 2000
			: (int)(otmp->quan/100L));
	    else if (otmp->oclass == BALL_CLASS || otmp->oclass == CHAIN_CLASS)
		basenutrit = weight(otmp);
	    /* oc_nutrition is usually weight anyway */
	    else basenutrit = objects[otmp->otyp].oc_nutrition;
	    victual.nmod = basenutrit;
	    victual.eating = TRUE; /* needed for lesshungry() */

	    /* Eating non-food-objects breaks food-conducts here */
	    material = objects[otmp->otyp].oc_material;
	    if (material == LEATHER || material == BONE || material == DRAGON_HIDE)
		violated(CONDUCT_VEGETARIAN);
	    else if (material == WAX)
		violated(CONDUCT_VEGAN);
	    else
		violated(CONDUCT_FOODLESS);

	    if (otmp->cursed)
		rottenfood(otmp);

	    if (otmp->oclass == WEAPON_CLASS && otmp->opoisoned) {
		pline("Ecch - that must have been poisonous!");
		if (!FPoison_resistance) {
		    if (!Poison_resistance)
			losestr(rnd(4), FALSE);
		    losehp(rnd(PPoison_resistance ? 7 : 15),
			   xname(otmp), KILLED_BY_AN);
		} else {
		    pline("You seem unaffected by the poison.");
		}
	    } else if (!otmp->cursed)
		pline("This %s is delicious!",
		      otmp->oclass == COIN_CLASS ? foodword(otmp) :
		      singular(otmp, xname));

	    eatspecial();
	    return 1;
	}

	/* [ALI] Hero polymorphed in the meantime. */
	if (otmp == victual.piece && is_vampiric(youmonst.data) != otmp->odrained)
	    victual.piece = NULL;	/* can't resume */

	/* [ALI] Blood can coagulate during the interruption
	 *       but not during the draining process.
	 */
	if (otmp == victual.piece && otmp->odrained &&
	    peek_at_iced_corpse_age(otmp) + victual.usedtime + 5 < moves)
	    victual.piece = NULL;	/* can't resume */

	if (otmp == victual.piece) {
	/* If they weren't able to choke, they don't suddenly become able to
	 * choke just because they were interrupted.  On the other hand, if
	 * they were able to choke before, if they lost food it's possible
	 * they shouldn't be able to choke now.
	 */
	    if (u.uhs != SATIATED) victual.canchoke = FALSE;
	    victual.piece = touchfood(otmp);
	    pline("You resume your meal.");
	    start_eating(victual.piece);
	    return 1;
	}

	/* nothing in progress - so try to find something. */
	/* tins are a special case */
	/* tins must also check conduct separately in case they're discarded */
	if (otmp->otyp == TIN) {
	    start_tin(otmp);
	    return 1;
	}

	victual.piece = otmp = touchfood(otmp);
	victual.usedtime = 0;

	/* Now we need to calculate delay and nutritional info.
	 * The base nutrition calculated here and in eatcorpse() accounts
	 * for normal vs. rotten food.  The reqtime and nutrit values are
	 * then adjusted in accordance with the amount of food left.
	 */
	if (otmp->otyp == CORPSE) {
	    int tmp = eatcorpse(otmp);
	    if (tmp == 3) {
		/* inedible */
		victual.piece = NULL;

		/* The combination of odrained == TRUE and oeaten == cnutrit
		 * represents the case of starting to drain a corpse but not
		 * getting any further (e.g. losing consciousness due to
		 * rotten food). We must preserve this case to avoid corpses
		 * changing appearance after a failed attempt to eat.
		 */
		if (!otmp->odrained && otmp->oeaten == mons[otmp->corpsenm].cnutrit)
		    otmp->oeaten = 0;
		/* ALI, conduct: didn't eat it after all */
		u.uconduct.food--;
		return 0;
	    } else if (tmp == 2) {
		/* used up */
		victual.piece = NULL;
		return 1;
	    } else if (tmp)
		dont_start = TRUE;
	    /* if not used up, eatcorpse sets up reqtime and may modify
	     * oeaten */
	} else {
	    /* No checks for WAX, LEATHER, BONE, DRAGON_HIDE.  These are
	     * all handled in the != FOOD_CLASS case, above */
	    switch (objects[otmp->otyp].oc_material) {
	    case FLESH:
		if (otmp->otyp == EGG)
		    violated(CONDUCT_VEGAN);
		else
		    violated(CONDUCT_VEGETARIAN);
		break;

	    default:
		if (otmp->otyp == PANCAKE ||
		    otmp->otyp == FORTUNE_COOKIE || /* eggs */
		    otmp->otyp == CREAM_PIE ||
		    otmp->otyp == CANDY_BAR || /* milk */
		    otmp->otyp == LUMP_OF_ROYAL_JELLY)
		    violated(CONDUCT_VEGAN);
		else
		    violated(CONDUCT_FOODLESS);
		break;
	    }

	    victual.reqtime = objects[otmp->otyp].oc_delay;
	    if (otmp->otyp != FORTUNE_COOKIE &&
		(otmp->cursed ||
		 (((moves - otmp->age) > (otmp->blessed ? 50 : 30)) &&
		(otmp->orotten || !rn2(7))))) {

		if (rottenfood(otmp)) {
		    otmp->orotten = TRUE;
		    dont_start = TRUE;
		}
		if (otmp->oeaten < 2) {
		    victual.piece = NULL;
		    if (carried(otmp)) useup(otmp);
		    else useupf(otmp, 1L);
		    return 1;
		} else {
		    consume_oeaten(otmp, 1);	/* oeaten >>= 1 */
		}
	    } else fprefx(otmp);
	}

	/* re-calc the nutrition */
	if (otmp->otyp == CORPSE) basenutrit = mons[otmp->corpsenm].cnutrit;
	else basenutrit = objects[otmp->otyp].oc_nutrition;
	nutrit = otmp->oeaten;
	if (otmp->otyp == CORPSE && otmp->odrained) {
	    nutrit -= drainlevel(otmp);
	    basenutrit -= drainlevel(otmp);
	}

	victual.reqtime = (basenutrit == 0 ? 0 :
		rounddiv(victual.reqtime * (long)nutrit, basenutrit));

	/* calculate the modulo value (nutrit. units per round eating)
	 * note: this isn't exact - you actually lose a little nutrition
	 *	 due to this method.
	 * TODO: add in a "remainder" value to be given at the end of the
	 *	 meal.
	 */
	if (victual.reqtime == 0 || nutrit == 0)
	    /* possible if most has been eaten before */
	    victual.nmod = 0;
	else if (nutrit >= victual.reqtime)
	    victual.nmod = -(nutrit / victual.reqtime);
	else
	    victual.nmod = victual.reqtime % nutrit;
	victual.canchoke = (u.uhs == SATIATED);

	if (!dont_start) start_eating(otmp);
	return 1;
}